

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int parse_fn_args_body(Parser *psr)

{
  BcIns ins;
  Function *fn;
  uint64_t arg_name;
  FnScope scope;
  int fn_idx;
  Parser *psr_local;
  
  arg_name._0_4_ = vm_new_fn(psr->vm,psr->pkg);
  arg_name._4_4_ = psr->locals_count;
  scope.fn = 0;
  scope._8_8_ = psr->scope;
  psr->scope = (FnScope *)&arg_name;
  scope.outer_scope._4_4_ = (int)arg_name;
  lex_expect(&psr->lxr,0x28);
  lex_next(&psr->lxr);
  while ((psr->lxr).tk.type == 0x114) {
    psr_new_local(psr,(psr->lxr).tk.field_4.ident_hash);
    scope.fn = scope.fn + 1;
    lex_next(&psr->lxr);
    if ((psr->lxr).tk.type != 0x2c) break;
    lex_next(&psr->lxr);
  }
  lex_expect(&psr->lxr,0x29);
  lex_next(&psr->lxr);
  lex_expect(&psr->lxr,0x7b);
  lex_next(&psr->lxr);
  parse_block(psr);
  lex_expect(&psr->lxr,0x7d);
  lex_next(&psr->lxr);
  fn = psr_fn(psr);
  ins = bc_new3(BC_RET,'\0','\0','\0');
  fn_emit(fn,ins);
  psr->locals_count = arg_name._4_4_;
  psr->scope = (FnScope *)scope._8_8_;
  return scope.outer_scope._4_4_;
}

Assistant:

static int parse_fn_args_body(Parser *psr) {
	// Create a new function
	int fn_idx = vm_new_fn(psr->vm, psr->pkg);

	// Create the new function scope
	FnScope scope;
	scope.fn = fn_idx;
	scope.first_local = psr->locals_count;
	scope.next_slot = 0;
	scope.outer_scope = psr->scope;
	psr->scope = &scope;

	// Expect the argument list, adding each one as a new local
	lex_expect(&psr->lxr, '(');
	lex_next(&psr->lxr);
	while (psr->lxr.tk.type == TK_IDENT) {
		// Add the argument as a local
		uint64_t arg_name = psr->lxr.tk.ident_hash;
		psr_new_local(psr, arg_name);
		scope.next_slot++;
		lex_next(&psr->lxr);

		// Expect a comma or closing parenthesis
		if (psr->lxr.tk.type != ',') {
			break;
		} else {
			// Skip the comma
			lex_next(&psr->lxr);
		}
	}
	lex_expect(&psr->lxr, ')');
	lex_next(&psr->lxr);

	// Parse the contents of the function definition
	lex_expect(&psr->lxr, '{');
	lex_next(&psr->lxr);
	parse_block(psr);
	lex_expect(&psr->lxr, '}');
	lex_next(&psr->lxr);

	// Add the final RET instruction
	fn_emit(psr_fn(psr), bc_new3(BC_RET, 0, 0, 0));

	// Get rid of the function definition arguments on the parser's locals list
	psr->locals_count = scope.first_local;

	// Return to the outer function scope
	psr->scope = scope.outer_scope;
	return fn_idx;
}